

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

int doattributes(void)

{
  nh_menuitem *pnVar1;
  int iVar2;
  aligntyp aVar3;
  aligntyp aVar4;
  int iVar5;
  schar sVar6;
  schar sVar7;
  schar sVar8;
  schar sVar9;
  schar sVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  menulist menu;
  int selected [1];
  char buf [256];
  char buf2 [256];
  menulist local_260;
  menulist local_250;
  int local_23c;
  ulong local_238;
  undefined6 uStack_230;
  undefined2 uStack_22a;
  undefined6 uStack_228;
  char local_138 [264];
  
  init_menulist(&local_250);
  local_138[0] = '\0';
  local_238 = local_238 & 0xffffffffffffff00;
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  local_250.items[local_250.icount].id = 0;
  local_250.items[local_250.icount].role = MI_HEADING;
  local_250.items[local_250.icount].accel = '\0';
  local_250.items[local_250.icount].group_accel = '\0';
  local_250.items[local_250.icount].selected = '\0';
  builtin_strncpy(local_250.items[local_250.icount].caption,"Character Inform",0x10);
  builtin_strncpy(local_250.items[local_250.icount].caption + 0xe,"rmation",8);
  local_250.icount = local_250.icount + 1;
  sprintf((char *)&local_238,minimal_enlightenment_fmtstr_noorig,"name",plname);
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  local_250.icount = local_250.icount + 1;
  if (u.umonnum == u.umonster) {
    sprintf((char *)&local_238,minimal_enlightenment_fmtstr_noorig,"race",urace.noun);
  }
  else {
    pcVar13 = mons_mname(youmonst.data);
    sprintf((char *)&local_238,"%-10s: %-12s (started %s)","race",pcVar13,urace.noun);
  }
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  local_250.icount = local_250.icount + 1;
  if (u.umonnum == u.umonster) {
    if (flags.female == '\0') goto LAB_00154e4f;
LAB_00154e3f:
    pcVar13 = urole.name.f;
    if (urole.name.f == (char *)0x0) goto LAB_00154e4f;
  }
  else {
    if ((u._1052_1_ & 8) != 0) goto LAB_00154e3f;
LAB_00154e4f:
    pcVar13 = urole.name.m;
  }
  sprintf((char *)&local_238,minimal_enlightenment_fmtstr_noorig,"role",pcVar13);
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  local_250.icount = local_250.icount + 1;
  iVar11 = 2;
  if (((youmonst.data)->mflags2 & 0x40000) == 0) {
    iVar11 = (int)flags.female;
  }
  if (iVar11 == u.initgend) {
    sprintf((char *)&local_238,minimal_enlightenment_fmtstr_noorig,"gender",genders[iVar11].adj);
  }
  else {
    sprintf((char *)&local_238,"%-10s: %-12s (started %s)","gender",genders[iVar11].adj,
            genders[u.initgend].adj);
  }
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  aVar4 = u.ualignbase[1];
  aVar3 = u.ualign.type;
  local_250.icount = local_250.icount + 1;
  pcVar13 = align_str(u.ualign.type);
  if (aVar3 == aVar4) {
    sprintf((char *)&local_238,minimal_enlightenment_fmtstr_noorig,"alignment",pcVar13);
  }
  else {
    pcVar14 = align_str(u.ualignbase[1]);
    sprintf((char *)&local_238,"%-10s: %-12s (started %s)","alignment",pcVar13,pcVar14);
  }
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  local_250.icount = local_250.icount + 1;
  sVar6 = acurr(0);
  sVar7 = acurr(0);
  if (sVar6 < '\x13') {
    uVar19 = (ulong)(uint)(int)sVar7;
    pcVar13 = "attributes: St:%-1d ";
LAB_001550de:
    sprintf((char *)&local_238,pcVar13,uVar19);
  }
  else {
    sVar6 = acurr(0);
    if ('v' < sVar7) {
      uVar19 = (ulong)((int)sVar6 - 100);
      pcVar13 = "attributes: St:%2d ";
      goto LAB_001550de;
    }
    if (sVar6 < 'v') {
      sVar6 = acurr(0);
      uVar19 = (ulong)((int)sVar6 - 0x12);
      pcVar13 = "attributes: St:18/%02d ";
      goto LAB_001550de;
    }
    local_238._0_1_ = 'a';
    local_238._1_1_ = 't';
    local_238._2_1_ = 't';
    local_238._3_1_ = 'r';
    local_238._4_1_ = 'i';
    local_238._5_1_ = 'b';
    local_238._6_1_ = 'u';
    local_238._7_1_ = 't';
    uStack_230 = 0x7453203a7365;
    uStack_22a = 0x313a;
    uStack_228 = 0x202a2a2f38;
  }
  pcVar13 = eos((char *)&local_238);
  sVar6 = acurr(3);
  sVar7 = acurr(4);
  sVar8 = acurr(1);
  sVar9 = acurr(2);
  sVar10 = acurr(5);
  iVar11 = (int)sVar10;
  sprintf(pcVar13,"Dx:%-1d Co:%-1d In:%-1d Wi:%-1d Ch:%-1d",(ulong)(uint)(int)sVar6,
          (ulong)(uint)(int)sVar7,(ulong)(uint)(int)sVar8,(ulong)(uint)(int)sVar9,iVar11);
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  iVar5 = u.uexp;
  iVar2 = u.ulevel;
  local_250.icount = local_250.icount + 1;
  if (u.ulevel < 0x1e) {
    lVar18 = newuexp(u.ulevel);
    sprintf((char *)&local_238,"%-10s: %d (exp: %d, %ld needed)","level",(ulong)(uint)iVar2,
            (ulong)(uint)iVar5,lVar18,iVar11);
  }
  else {
    sprintf((char *)&local_238,"%-10s: %d (exp: %d)","level",(ulong)(uint)u.ulevel,
            (ulong)(uint)u.uexp);
  }
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  local_250.icount = local_250.icount + 1;
  if (flags.debug != '\0') {
    sprintf(local_138,"(%2d,%2d)",(ulong)(uint)(int)u.ux,(ulong)(uint)(int)u.uy);
    sprintf((char *)&local_238,minimal_enlightenment_fmtstr_noorig,"position",local_138);
    lVar18 = (long)local_250.size;
    if (local_250.size <= local_250.icount) {
      local_250.size = local_250.size * 2;
      local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
    }
    pnVar1 = local_250.items + local_250.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,(char *)&local_238);
    local_250.icount = local_250.icount + 1;
  }
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  lVar18 = (long)local_250.icount;
  local_250.items[lVar18].accel = '\0';
  local_250.items[lVar18].group_accel = '\0';
  local_250.items[lVar18].selected = '\0';
  local_250.items[lVar18].caption[0] = '\0';
  local_250.items[lVar18].id = 0;
  local_250.items[lVar18].role = MI_TEXT;
  local_250.icount = local_250.icount + 1;
  if (u.umonnum == u.umonster) {
    if (flags.female == '\0') goto LAB_001553df;
LAB_001553cf:
    pcVar13 = urole.name.f;
    if (urole.name.f == (char *)0x0) goto LAB_001553df;
  }
  else {
    if ((u._1052_1_ & 8) != 0) goto LAB_001553cf;
LAB_001553df:
    pcVar13 = urole.name.m;
  }
  sprintf((char *)&local_238,"%s Deities",pcVar13);
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_HEADING;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  local_250.icount = local_250.icount + 1;
  pcVar14 = align_gname(-1);
  pcVar13 = "";
  pcVar16 = "";
  if (u.ualign.type == -1) {
    pcVar16 = " (c)";
  }
  pcVar20 = " (s)";
  if (u.ualignbase[1] == -1) {
    pcVar16 = " (s)";
  }
  if ((byte)(u.ualign.type & u.ualignbase[1]) == 0xff) {
    pcVar16 = " (s,c)";
  }
  sprintf(local_138,"%-17s%s",pcVar14,pcVar16);
  sprintf((char *)&local_238,minimal_enlightenment_fmtstr_noorig,"Chaotic",local_138);
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  local_250.icount = local_250.icount + 1;
  pcVar14 = align_gname('\0');
  pcVar16 = "";
  if (u.ualign.type == '\0') {
    pcVar16 = " (c)";
  }
  if (u.ualignbase[1] == '\0') {
    pcVar16 = " (s)";
  }
  if (u.ualign.type == '\0' && u.ualignbase[1] == '\0') {
    pcVar16 = " (s,c)";
  }
  sprintf(local_138,"%-17s%s",pcVar14,pcVar16);
  sprintf((char *)&local_238,minimal_enlightenment_fmtstr_noorig,"Neutral",local_138);
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  local_250.icount = local_250.icount + 1;
  pcVar14 = align_gname('\x01');
  if (u.ualign.type == '\x01') {
    pcVar13 = " (c)";
    pcVar20 = " (s,c)";
  }
  if (u.ualignbase[1] != '\x01') {
    pcVar20 = pcVar13;
  }
  sprintf(local_138,"%-17s%s",pcVar14,pcVar20);
  sprintf((char *)&local_238,minimal_enlightenment_fmtstr_noorig,"Lawful",local_138);
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  pnVar1 = local_250.items + local_250.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&local_238);
  local_250.icount = local_250.icount + 1;
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  lVar18 = (long)local_250.icount;
  local_250.items[lVar18].accel = '\0';
  local_250.items[lVar18].group_accel = '\0';
  local_250.items[lVar18].selected = '\0';
  local_250.items[lVar18].caption[0] = '\0';
  local_250.items[lVar18].id = 0;
  local_250.items[lVar18].role = MI_TEXT;
  local_250.icount = local_250.icount + 1;
  if (local_250.size <= local_250.icount) {
    lVar18 = (long)local_250.size;
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  local_250.items[local_250.icount].id = 0;
  local_250.items[local_250.icount].role = MI_HEADING;
  local_250.items[local_250.icount].accel = '\0';
  local_250.items[local_250.icount].group_accel = '\0';
  local_250.items[local_250.icount].selected = '\0';
  builtin_strncpy(local_250.items[local_250.icount].caption,"Other Informatio",0x10);
  local_250.items[local_250.icount].caption[0x10] = 'n';
  local_250.items[local_250.icount].caption[0x11] = '\0';
  local_250.icount = local_250.icount + 1;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,(long)local_250.size * 0x10c);
  }
  lVar18 = (long)local_250.icount;
  local_250.items[lVar18].id = 0x69;
  local_250.items[lVar18].role = MI_NORMAL;
  local_250.items[lVar18].accel = 'i';
  local_250.items[lVar18].group_accel = '\0';
  local_250.items[lVar18].selected = '\0';
  builtin_strncpy(local_250.items[lVar18].caption,"Inventor",8);
  local_250.items[lVar18].caption[8] = 'y';
  local_250.items[lVar18].caption[9] = '\0';
  local_250.icount = local_250.icount + 1;
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  lVar18 = (long)local_250.icount;
  local_250.items[lVar18].id = 0x73;
  local_250.items[lVar18].role = MI_NORMAL;
  local_250.items[lVar18].accel = 's';
  local_250.items[lVar18].group_accel = '\0';
  local_250.items[lVar18].selected = '\0';
  builtin_strncpy(local_250.items[lVar18].caption,"Skil",4);
  builtin_strncpy(local_250.items[lVar18].caption + 3,"lls",4);
  local_250.icount = local_250.icount + 1;
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  lVar18 = (long)local_250.icount;
  local_250.items[lVar18].id = 0x6e;
  local_250.items[lVar18].role = MI_NORMAL;
  local_250.items[lVar18].accel = 'n';
  local_250.items[lVar18].group_accel = '\0';
  local_250.items[lVar18].selected = '\0';
  builtin_strncpy(local_250.items[lVar18].caption,"Intrinsi",8);
  builtin_strncpy(local_250.items[lVar18].caption + 7,"ics",4);
  local_250.icount = local_250.icount + 1;
  iVar11 = num_vanquished();
  if (0 < iVar11) {
    lVar18 = (long)local_250.size;
    if (local_250.size <= local_250.icount) {
      local_250.size = local_250.size * 2;
      local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
    }
    local_250.items[local_250.icount].id = 0x76;
    local_250.items[local_250.icount].role = MI_NORMAL;
    local_250.items[local_250.icount].accel = 'v';
    local_250.items[local_250.icount].group_accel = '\0';
    local_250.items[local_250.icount].selected = '\0';
    builtin_strncpy(local_250.items[local_250.icount].caption,"Vanquished creat",0x10);
    builtin_strncpy(local_250.items[local_250.icount].caption + 0xd,"eatures",8);
    local_250.icount = local_250.icount + 1;
  }
  iVar11 = num_genocides();
  if ((0 < iVar11) || (iVar11 = num_extinctions(), 0 < iVar11)) {
    lVar18 = (long)local_250.size;
    if (local_250.size <= local_250.icount) {
      local_250.size = local_250.size * 2;
      local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
    }
    local_250.items[local_250.icount].id = 0x67;
    local_250.items[local_250.icount].role = MI_NORMAL;
    local_250.items[local_250.icount].accel = 'g';
    local_250.items[local_250.icount].group_accel = '\0';
    local_250.items[local_250.icount].selected = '\0';
    builtin_strncpy(local_250.items[local_250.icount].caption,"Genocided/extinc",0x10);
    builtin_strncpy(local_250.items[local_250.icount].caption + 0xc,"tinct creatures",0x10);
    local_250.icount = local_250.icount + 1;
  }
  lVar18 = (long)local_250.size;
  if (local_250.size <= local_250.icount) {
    local_250.size = local_250.size * 2;
    local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
  }
  local_250.items[local_250.icount].id = 99;
  local_250.items[local_250.icount].role = MI_NORMAL;
  local_250.items[local_250.icount].accel = 'c';
  local_250.items[local_250.icount].group_accel = '\0';
  local_250.items[local_250.icount].selected = '\0';
  builtin_strncpy(local_250.items[local_250.icount].caption,"Conducts followe",0x10);
  local_250.items[local_250.icount].caption[0x10] = 'd';
  local_250.items[local_250.icount].caption[0x11] = '\0';
  local_250.icount = local_250.icount + 1;
  if (flags.explore != '\0' || flags.debug != '\0') {
    lVar18 = (long)local_250.size;
    if (local_250.size <= local_250.icount) {
      local_250.size = local_250.size * 2;
      local_250.items = (nh_menuitem *)realloc(local_250.items,lVar18 * 0x218);
    }
    local_250.items[local_250.icount].id = 0x77;
    local_250.items[local_250.icount].role = MI_NORMAL;
    local_250.items[local_250.icount].accel = 'w';
    local_250.items[local_250.icount].group_accel = '\0';
    local_250.items[local_250.icount].selected = '\0';
    builtin_strncpy(local_250.items[local_250.icount].caption,"Debug/explore mo",0x10);
    builtin_strncpy(local_250.items[local_250.icount].caption + 0xc,"e mode spoilers",0x10);
    local_250.icount = local_250.icount + 1;
  }
  iVar11 = display_menu(local_250.items,local_250.icount,"Your Attributes:",1,&local_23c);
  if (iVar11 != 1) goto switchD_00155b75_caseD_6f;
  if (local_23c < 0x6e) {
    if (local_23c == 99) {
      show_conduct(0);
    }
    else if (local_23c == 0x67) {
      list_genocided('y','\0');
    }
    else if (local_23c == 0x69) {
      ddoinv();
    }
    goto switchD_00155b75_caseD_6f;
  }
  switch(local_23c) {
  case 0x6e:
    init_menulist(&local_260);
    iVar11 = local_260.icount;
    if ((u.uprops[1].intrinsic & 0xfbffffff) == 0) {
      if (u.uprops[1].intrinsic != 0) {
        lVar18 = (long)local_260.size;
        if (local_260.size <= local_260.icount) {
          local_260.size = local_260.size * 2;
          local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
        }
        local_260.items[local_260.icount].id = 0;
        local_260.items[local_260.icount].role = MI_TEXT;
        local_260.items[local_260.icount].accel = '\0';
        local_260.items[local_260.icount].group_accel = '\0';
        local_260.items[local_260.icount].selected = '\0';
        builtin_strncpy(local_260.items[local_260.icount].caption,"You resist fire.",0x10);
        local_260.items[local_260.icount].caption[0x10] = '\0';
        goto LAB_00155d46;
      }
    }
    else {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are immune t",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0x10,"o fire.",8);
LAB_00155d46:
      local_260.icount = local_260.icount + 1;
    }
    if ((u.uprops[2].intrinsic & 0xfbffffff) == 0) {
      if (u.uprops[2].intrinsic != 0) {
        lVar18 = (long)local_260.size;
        if (local_260.size <= local_260.icount) {
          local_260.size = local_260.size * 2;
          local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
        }
        local_260.items[local_260.icount].id = 0;
        local_260.items[local_260.icount].role = MI_TEXT;
        local_260.items[local_260.icount].accel = '\0';
        local_260.items[local_260.icount].group_accel = '\0';
        local_260.items[local_260.icount].selected = '\0';
        builtin_strncpy(local_260.items[local_260.icount].caption,"You resist cold.",0x10);
        local_260.items[local_260.icount].caption[0x10] = '\0';
        goto LAB_00155e2b;
      }
    }
    else {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are immune t",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0x10,"o cold.",8);
LAB_00155e2b:
      local_260.icount = local_260.icount + 1;
    }
    if ((u.uprops[3].intrinsic & 0xfbffffff) == 0) {
      if (u.uprops[3].intrinsic != 0) {
        lVar18 = (long)local_260.size;
        if (local_260.size <= local_260.icount) {
          local_260.size = local_260.size * 2;
          local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
        }
        local_260.items[local_260.icount].id = 0;
        local_260.items[local_260.icount].role = MI_TEXT;
        local_260.items[local_260.icount].accel = '\0';
        local_260.items[local_260.icount].group_accel = '\0';
        local_260.items[local_260.icount].selected = '\0';
        builtin_strncpy(local_260.items[local_260.icount].caption,"You resist sleep",0x10);
        local_260.items[local_260.icount].caption[0x10] = '.';
        local_260.items[local_260.icount].caption[0x11] = '\0';
        goto LAB_00155f0f;
      }
    }
    else {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are immune t",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 9,"mmune to sleep.",0x10);
LAB_00155f0f:
      local_260.icount = local_260.icount + 1;
    }
    if ((u.uprops[4].intrinsic & 0xfbffffff) == 0) {
      if (u.uprops[4].intrinsic != 0) {
        lVar18 = (long)local_260.size;
        if (local_260.size <= local_260.icount) {
          local_260.size = local_260.size * 2;
          local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
        }
        local_260.items[local_260.icount].id = 0;
        local_260.items[local_260.icount].role = MI_TEXT;
        local_260.items[local_260.icount].accel = '\0';
        local_260.items[local_260.icount].group_accel = '\0';
        local_260.items[local_260.icount].selected = '\0';
        builtin_strncpy(local_260.items[local_260.icount].caption,"You resist disin",0x10);
        builtin_strncpy(local_260.items[local_260.icount].caption + 0xb,"disintegration.",0x10);
        goto LAB_00156002;
      }
    }
    else {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are immune t",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0x10,"o disintegration",0x10);
      local_260.items[local_260.icount].caption[0x20] = '.';
      local_260.items[local_260.icount].caption[0x21] = '\0';
LAB_00156002:
      local_260.icount = local_260.icount + 1;
    }
    if ((u.uprops[5].intrinsic & 0xfbffffff) == 0) {
      if (u.uprops[5].intrinsic != 0) {
        lVar18 = (long)local_260.size;
        if (local_260.size <= local_260.icount) {
          local_260.size = local_260.size * 2;
          local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
        }
        local_260.items[local_260.icount].id = 0;
        local_260.items[local_260.icount].role = MI_TEXT;
        local_260.items[local_260.icount].accel = '\0';
        local_260.items[local_260.icount].group_accel = '\0';
        local_260.items[local_260.icount].selected = '\0';
        builtin_strncpy(local_260.items[local_260.icount].caption,"You resist elect",0x10);
        builtin_strncpy(local_260.items[local_260.icount].caption + 0x10,"ricity.",8);
        goto LAB_001560f1;
      }
    }
    else {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are immune t",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xf,"to electricity.",0x10);
LAB_001560f1:
      local_260.icount = local_260.icount + 1;
    }
    if ((u.uprops[6].intrinsic & 0xfbffffff) == 0) {
      if (u.uprops[6].intrinsic != 0) {
        lVar18 = (long)local_260.size;
        if (local_260.size <= local_260.icount) {
          local_260.size = local_260.size * 2;
          local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
        }
        local_260.items[local_260.icount].id = 0;
        local_260.items[local_260.icount].role = MI_TEXT;
        local_260.items[local_260.icount].accel = '\0';
        local_260.items[local_260.icount].group_accel = '\0';
        local_260.items[local_260.icount].selected = '\0';
        builtin_strncpy(local_260.items[local_260.icount].caption,"You resist poiso",0x10);
        builtin_strncpy(local_260.items[local_260.icount].caption + 0xf,"on.",4);
        goto LAB_001561d9;
      }
    }
    else {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are immune t",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 10,"mune to poison.",0x10);
LAB_001561d9:
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x35].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are immune t",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xf,"to level-drain.",0x10);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x34].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are immune t",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xc,"ne to sickness.",0x10);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0xc].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You see invisibl",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xf,"le.",4);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x19].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are telepath",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0x10,"ic.",4);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x18].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      lVar18 = (long)local_260.icount;
      local_260.items[lVar18].id = 0;
      local_260.items[lVar18].role = MI_TEXT;
      local_260.items[lVar18].accel = '\0';
      local_260.items[lVar18].group_accel = '\0';
      local_260.items[lVar18].selected = '\0';
      builtin_strncpy(local_260.items[lVar18].caption,"You are warned.",0x10);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0xb].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You have automat",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xe,"atic searching.",0x10);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x40].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You have infravi",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xe,"vision.",8);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0xd].intrinsic != 0) {
      uVar17 = u.uprops[0xd].blocked;
      uVar12 = u.uprops[0xc].extrinsic;
      uVar15 = u.uprops[0xc].intrinsic;
      if ((u.uprops[0xd].blocked == 0 && u.uprops[0xc].intrinsic == 0) &&
          u.uprops[0xc].extrinsic == 0) {
        if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
          lVar18 = (long)local_260.size;
          if (local_260.size <= local_260.icount) {
            local_260.size = local_260.size * 2;
            local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
          }
          local_260.items[local_260.icount].id = 0;
          local_260.items[local_260.icount].role = MI_TEXT;
          local_260.items[local_260.icount].accel = '\0';
          local_260.items[local_260.icount].group_accel = '\0';
          local_260.items[local_260.icount].selected = '\0';
          builtin_strncpy(local_260.items[local_260.icount].caption,"You are invisibl",0x10);
          builtin_strncpy(local_260.items[local_260.icount].caption + 0xf,"le.",4);
          local_260.icount = local_260.icount + 1;
          uVar17 = u.uprops[0xd].blocked;
          uVar12 = u.uprops[0xc].extrinsic;
          uVar15 = u.uprops[0xc].intrinsic;
          if (u.uprops[0xd].intrinsic == 0) goto LAB_00156687;
        }
        else {
          uVar17 = 0;
          uVar12 = 0;
          uVar15 = 0;
        }
      }
      if ((((uVar17 != 0) || (uVar15 != 0)) || (uVar12 != 0)) ||
         (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
        lVar18 = (long)local_260.size;
        if (local_260.size <= local_260.icount) {
          local_260.size = local_260.size * 2;
          local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
        }
        local_260.items[local_260.icount].id = 0;
        local_260.items[local_260.icount].role = MI_TEXT;
        local_260.items[local_260.icount].accel = '\0';
        local_260.items[local_260.icount].group_accel = '\0';
        local_260.items[local_260.icount].selected = '\0';
        builtin_strncpy(local_260.items[local_260.icount].caption,"You are invisibl",0x10);
        builtin_strncpy(local_260.items[local_260.icount].caption + 0xd,"ible to others.",0x10);
        local_260.icount = local_260.icount + 1;
      }
    }
LAB_00156687:
    if (u.uprops[0x13].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are stealthy",0x10);
      local_260.items[local_260.icount].caption[0x10] = '.';
      local_260.items[local_260.icount].caption[0x11] = '\0';
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x14].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You aggravte mon",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xf,"nsters.",8);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x15].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You cause confli",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0x10,"ct.",4);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x26].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      lVar18 = (long)local_260.icount;
      local_260.items[lVar18].id = 0;
      local_260.items[lVar18].role = MI_TEXT;
      local_260.items[lVar18].accel = '\0';
      local_260.items[lVar18].group_accel = '\0';
      local_260.items[lVar18].selected = '\0';
      builtin_strncpy(local_260.items[lVar18].caption,"You can ",8);
      builtin_strncpy(local_260.items[lVar18].caption + 6,"n jump.",8);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0xe].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You can teleport",0x10);
      local_260.items[local_260.icount].caption[0x10] = '.';
      local_260.items[local_260.icount].caption[0x11] = '\0';
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0xf].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You have telepor",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xb,"leport control.",0x10);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x39].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      lVar18 = (long)local_260.icount;
      local_260.items[lVar18].id = 0;
      local_260.items[lVar18].role = MI_TEXT;
      local_260.items[lVar18].accel = '\0';
      local_260.items[lVar18].group_accel = '\0';
      local_260.items[lVar18].selected = '\0';
      builtin_strncpy(local_260.items[lVar18].caption,"You can ",8);
      builtin_strncpy(local_260.items[lVar18].caption + 6,"n swim.",8);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x31].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You can survive ",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xd,"ve without air.",0x10);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x3e].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You can walk thr",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xc," through walls.",0x10);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x16].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are protecte",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xf,"ed.",4);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x10].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You are polymorh",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xd,"orhing.",8);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x11].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      local_260.items[local_260.icount].id = 0;
      local_260.items[local_260.icount].role = MI_TEXT;
      local_260.items[local_260.icount].accel = '\0';
      local_260.items[local_260.icount].group_accel = '\0';
      local_260.items[local_260.icount].selected = '\0';
      builtin_strncpy(local_260.items[local_260.icount].caption,"You have polymor",0x10);
      builtin_strncpy(local_260.items[local_260.icount].caption + 0xc,"ymorph control.",0x10);
      local_260.icount = local_260.icount + 1;
    }
    if (u.uprops[0x1a].intrinsic != 0) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= local_260.icount) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
      }
      lVar18 = (long)local_260.icount;
      local_260.items[lVar18].id = 0;
      local_260.items[lVar18].role = MI_TEXT;
      local_260.items[lVar18].accel = '\0';
      local_260.items[lVar18].group_accel = '\0';
      local_260.items[lVar18].selected = '\0';
      builtin_strncpy(local_260.items[lVar18].caption,"You are ",8);
      builtin_strncpy(local_260.items[lVar18].caption + 6,"e fast.",8);
      local_260.icount = local_260.icount + 1;
    }
    if (iVar11 == local_260.icount) {
      lVar18 = (long)local_260.size;
      if (local_260.size <= iVar11) {
        local_260.size = local_260.size * 2;
        local_260.items = (nh_menuitem *)realloc(local_260.items,lVar18 * 0x218);
        iVar11 = local_260.icount;
      }
      local_260.items[iVar11].id = 0;
      local_260.items[iVar11].role = MI_TEXT;
      local_260.items[iVar11].accel = '\0';
      local_260.items[iVar11].group_accel = '\0';
      local_260.items[iVar11].selected = '\0';
      builtin_strncpy(local_260.items[iVar11].caption,"You are rather m",0x10);
      builtin_strncpy(local_260.items[iVar11].caption + 0x10,"undane.",8);
      local_260.icount = iVar11 + 1;
    }
    display_menu(local_260.items,local_260.icount,"Your Intrinsics:",0,(int *)0x0);
    free(local_260.items);
    break;
  case 0x73:
    enhance_weapon_skill();
    break;
  case 0x76:
    list_vanquished('y','\0');
    break;
  case 0x77:
    if (flags.explore != '\0' || flags.debug != '\0') {
      enlightenment(0);
    }
  }
switchD_00155b75_caseD_6f:
  free(local_250.items);
  return 0;
}

Assistant:

static int doattributes(void)
{
	minimal_enlightenment();
	return 0;
}